

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  reference lff_00;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar4;
  cmListFileFunction *func;
  iterator __end5;
  iterator __begin5;
  vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *__range5;
  reference pbStack_b0;
  cmExecutionStatus status;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin4;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_88;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_78;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range4;
  string local_60 [8];
  string oldDef;
  undefined1 local_38 [8];
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> fb;
  cmExecutionStatus *inStatus_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmForEachFunctionBlocker *this_local;
  
  fb._M_t.super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
  super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
       (__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true>)
       inStatus;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff,
                          "foreach");
  if (bVar1) {
    this->Depth = this->Depth + 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)lff
                            ,"endforeach");
    if (bVar1) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_38,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
        if (bVar1) {
          std::__cxx11::string::string(local_60);
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->Args,0);
          pcVar3 = cmMakefile::GetDefinition(mf,pvVar2);
          if (pcVar3 != (char *)0x0) {
            pvVar2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&this->Args,0);
            pcVar3 = cmMakefile::GetDefinition(mf,pvVar2);
            std::__cxx11::string::operator=(local_60,pcVar3);
          }
          cVar4 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            (&this->Args);
          __begin4 = cVar4.Begin._M_current;
          local_88 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&__begin4,1);
          local_78 = &local_88;
          __end4 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::begin(local_78);
          arg = (string *)
                cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::end(local_78);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&arg);
            if (!bVar1) break;
            pbStack_b0 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&__end4);
            pvVar2 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&this->Args,0);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(mf,pvVar2,pcVar3);
            cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)((long)&__range5 + 4));
            __end5 = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::begin
                               (&this->Functions);
            func = (cmListFileFunction *)
                   std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::end
                             (&this->Functions);
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                (&__end5,(__normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                                          *)&func);
              if (!bVar1) break;
              lff_00 = __gnu_cxx::
                       __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
                       ::operator*(&__end5);
              cmExecutionStatus::Clear((cmExecutionStatus *)((long)&__range5 + 4));
              cmMakefile::ExecuteCommand(mf,lff_00,(cmExecutionStatus *)((long)&__range5 + 4));
              bVar1 = cmExecutionStatus::GetReturnInvoked
                                ((cmExecutionStatus *)((long)&__range5 + 4));
              if (bVar1) {
                cmExecutionStatus::SetReturnInvoked
                          ((cmExecutionStatus *)
                           fb._M_t.
                           super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                           .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl);
                pvVar2 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->Args,0);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmMakefile::AddDefinition(mf,pvVar2,pcVar3);
                goto LAB_0036f48b;
              }
              bVar1 = cmExecutionStatus::GetBreakInvoked((cmExecutionStatus *)((long)&__range5 + 4))
              ;
              if (bVar1) {
                pvVar2 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&this->Args,0);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmMakefile::AddDefinition(mf,pvVar2,pcVar3);
                goto LAB_0036f48b;
              }
              bVar1 = cmExecutionStatus::GetContinueInvoked
                                ((cmExecutionStatus *)((long)&__range5 + 4));
              if (bVar1) break;
              bVar1 = cmSystemTools::GetFatalErrorOccured();
              if (bVar1) goto LAB_0036f48b;
              __gnu_cxx::
              __normal_iterator<cmListFileFunction_*,_std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>_>
              ::operator++(&__end5);
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          pvVar2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->Args,0);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(mf,pvVar2,pcVar3);
LAB_0036f48b:
          this_local._7_1_ = true;
          oldDef.field_2._12_4_ = 1;
          std::__cxx11::string::~string(local_60);
        }
        else {
          this_local._7_1_ = false;
          oldDef.field_2._12_4_ = 1;
        }
        std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
                  ((unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                   local_38);
        return this_local._7_1_;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::IsFunctionBlocked(const cmListFileFunction& lff,
                                                 cmMakefile& mf,
                                                 cmExecutionStatus& inStatus)
{
  if (lff.Name.Lower == "foreach") {
    // record the number of nested foreach commands
    this->Depth++;
  } else if (lff.Name.Lower == "endforeach") {
    // if this is the endofreach for this statement
    if (!this->Depth) {
      // Remove the function blocker for this scope or bail.
      std::unique_ptr<cmFunctionBlocker> fb(
        mf.RemoveFunctionBlocker(this, lff));
      if (!fb) {
        return false;
      }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0])) {
        oldDef = mf.GetDefinition(this->Args[0]);
      }

      for (std::string const& arg : cmMakeRange(this->Args).advance(1)) {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0], arg.c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for (cmListFileFunction const& func : this->Functions) {
          status.Clear();
          mf.ExecuteCommand(func, status);
          if (status.GetReturnInvoked()) {
            inStatus.SetReturnInvoked();
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetBreakInvoked()) {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0], oldDef.c_str());
            return true;
          }
          if (status.GetContinueInvoked()) {
            break;
          }
          if (cmSystemTools::GetFatalErrorOccured()) {
            return true;
          }
        }
      }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0], oldDef.c_str());
      return true;
    }
    // close out a nested foreach
    this->Depth--;
  }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}